

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::CheckUint(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            *this,Context *context,uint64_t i)

{
  ushort uVar1;
  ulong uVar2;
  bool bVar3;
  ValueType *actualType;
  Ch *pCVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  ValidateErrorCode validateErrorCode;
  undefined4 uVar5;
  undefined4 uVar9;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  if ((this->type_ & 0x60) == 0) {
    actualType = GetIntegerString();
    DisallowedType(this,context,actualType);
    context->invalidCode = kValidateErrorType;
    this_00 = GetTypeString();
    goto LAB_0012f8a5;
  }
  uVar1 = (this->minimum_).data_.f.flags;
  uVar9 = (undefined4)(i >> 0x20);
  uVar5 = (undefined4)i;
  if (uVar1 == 0) {
LAB_0012f7ff:
    uVar1 = (this->maximum_).data_.f.flags;
    if (uVar1 != 0) {
      if ((uVar1 >> 8 & 1) == 0) {
        if ((char)uVar1 < '\0') {
          (*context->error_handler->_vptr_IValidationErrorHandler[6])
                    (context->error_handler,i,&this->maximum_,(ulong)this->exclusiveMaximum_);
LAB_0012f892:
          validateErrorCode = (uint)this->exclusiveMaximum_ | kValidateErrorMaximum;
          goto LAB_0012f89d;
        }
        auVar7._8_4_ = uVar9;
        auVar7._0_8_ = i;
        auVar7._12_4_ = 0x45300000;
        bVar3 = CheckDoubleMaximum(this,context,
                                   (auVar7._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,uVar5) - 4503599627370496.0));
        if (!bVar3) {
          return false;
        }
      }
      else {
        uVar2 = *(ulong *)&(this->maximum_).data_;
        if (this->exclusiveMaximum_ == true) {
          if (uVar2 <= i) {
LAB_0012f86a:
            (*context->error_handler->_vptr_IValidationErrorHandler[6])
                      (context->error_handler,i,&this->maximum_,(ulong)this->exclusiveMaximum_);
            goto LAB_0012f892;
          }
        }
        else if (uVar2 < i) goto LAB_0012f86a;
      }
    }
    uVar1 = (this->multipleOf_).data_.f.flags;
    if (uVar1 == 0) {
      return true;
    }
    if ((uVar1 >> 8 & 1) == 0) {
      auVar8._8_4_ = uVar9;
      auVar8._0_8_ = i;
      auVar8._12_4_ = 0x45300000;
      bVar3 = CheckDoubleMultipleOf
                        (this,context,
                         (auVar8._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,uVar5) - 4503599627370496.0));
      if (!bVar3) {
        return false;
      }
      return true;
    }
    if (i % *(ulong *)&(this->multipleOf_).data_ == 0) {
      return true;
    }
    (*context->error_handler->_vptr_IValidationErrorHandler[3])
              (context->error_handler,i,&this->multipleOf_);
    context->invalidCode = kValidateErrorMultipleOf;
    this_00 = GetMultipleOfString();
  }
  else {
    if ((uVar1 >> 8 & 1) == 0) {
      if ((-1 < (char)uVar1) &&
         (auVar6._8_4_ = uVar9, auVar6._0_8_ = i, auVar6._12_4_ = 0x45300000,
         bVar3 = CheckDoubleMinimum(this,context,
                                    (auVar6._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,uVar5) - 4503599627370496.0)),
         !bVar3)) {
        return false;
      }
      goto LAB_0012f7ff;
    }
    uVar2 = *(ulong *)&(this->minimum_).data_;
    if (this->exclusiveMinimum_ == true) {
      if (uVar2 < i) goto LAB_0012f7ff;
    }
    else if (uVar2 <= i) goto LAB_0012f7ff;
    (*context->error_handler->_vptr_IValidationErrorHandler[9])
              (context->error_handler,i,&this->minimum_,(ulong)this->exclusiveMinimum_);
    validateErrorCode = (uint)this->exclusiveMinimum_ | kValidateErrorMinimum;
LAB_0012f89d:
    context->invalidCode = validateErrorCode;
    this_00 = GetValidateErrorKeyword(validateErrorCode);
  }
LAB_0012f8a5:
  pCVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
  context->invalidKeyword = pCVar4;
  return false;
}

Assistant:

bool CheckUint(Context& context, uint64_t i) const {
        if (!(type_ & ((1 << kIntegerSchemaType) | (1 << kNumberSchemaType)))) {
            DisallowedType(context, GetIntegerString());
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorType);
        }

        if (!minimum_.IsNull()) {
            if (minimum_.IsUint64()) {
                if (exclusiveMinimum_ ? i <= minimum_.GetUint64() : i < minimum_.GetUint64()) {
                    context.error_handler.BelowMinimum(i, minimum_, exclusiveMinimum_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMinimum_ ? kValidateErrorExclusiveMinimum : kValidateErrorMinimum);
                }
            }
            else if (minimum_.IsInt64())
                /* do nothing */; // i >= 0 > minimum.Getint64()
            else if (!CheckDoubleMinimum(context, static_cast<double>(i)))
                return false;
        }

        if (!maximum_.IsNull()) {
            if (maximum_.IsUint64()) {
                if (exclusiveMaximum_ ? i >= maximum_.GetUint64() : i > maximum_.GetUint64()) {
                    context.error_handler.AboveMaximum(i, maximum_, exclusiveMaximum_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMaximum_ ? kValidateErrorExclusiveMaximum : kValidateErrorMaximum);
                }
            }
            else if (maximum_.IsInt64()) {
                context.error_handler.AboveMaximum(i, maximum_, exclusiveMaximum_);
                RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMaximum_ ? kValidateErrorExclusiveMaximum : kValidateErrorMaximum); // i >= 0 > maximum_
            }
            else if (!CheckDoubleMaximum(context, static_cast<double>(i)))
                return false;
        }

        if (!multipleOf_.IsNull()) {
            if (multipleOf_.IsUint64()) {
                if (i % multipleOf_.GetUint64() != 0) {
                    context.error_handler.NotMultipleOf(i, multipleOf_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMultipleOf);
                }
            }
            else if (!CheckDoubleMultipleOf(context, static_cast<double>(i)))
                return false;
        }

        return true;
    }